

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseEncName(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  iVar5 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar5 = 50000;
  }
  bVar1 = *ctxt->input->cur;
  if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
    pbVar3 = (byte *)(*xmlMalloc)(10);
    if (pbVar3 != (byte *)0x0) {
      *pbVar3 = bVar1;
      iVar9 = 10;
      uVar8 = 1;
      do {
        xmlNextChar(ctxt);
        bVar1 = *ctxt->input->cur;
        if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
           ((0x32 < bVar1 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) == 0))
           )) {
          pbVar3[uVar8 & 0xffffffff] = 0;
          return pbVar3;
        }
        if (iVar9 <= (int)uVar8 + 1) {
          iVar6 = 1;
          if (((0 < iVar9) && (iVar6 = -1, iVar9 < iVar5)) &&
             (uVar7 = iVar9 + 1U >> 1, iVar6 = uVar7 + iVar9, (int)(iVar5 - uVar7) < iVar9)) {
            iVar6 = iVar5;
          }
          if (iVar6 < 0) {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"EncName");
LAB_0013cc62:
            (*xmlFree)(pbVar3);
            bVar2 = false;
          }
          else {
            pbVar4 = (byte *)(*xmlRealloc)(pbVar3,(size_t)iVar6);
            if (pbVar4 == (byte *)0x0) {
              xmlCtxtErrMemory(ctxt);
              goto LAB_0013cc62;
            }
            bVar2 = true;
            pbVar3 = pbVar4;
            iVar9 = iVar6;
          }
          if (!bVar2) {
            return (xmlChar *)0x0;
          }
        }
        pbVar3[uVar8] = bVar1;
        uVar8 = uVar8 + 1;
      } while( true );
    }
    xmlCtxtErrMemory(ctxt);
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ENCODING_NAME,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseEncName(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;

    cur = CUR;
    if (((cur >= 'a') && (cur <= 'z')) ||
        ((cur >= 'A') && (cur <= 'Z'))) {
	buf = xmlMalloc(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}

	buf[len++] = cur;
	NEXT;
	cur = CUR;
	while (((cur >= 'a') && (cur <= 'z')) ||
	       ((cur >= 'A') && (cur <= 'Z')) ||
	       ((cur >= '0') && (cur <= '9')) ||
	       (cur == '.') || (cur == '_') ||
	       (cur == '-')) {
	    if (len + 1 >= size) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                if (newSize < 0) {
                    xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "EncName");
                    xmlFree(buf);
                    return(NULL);
                }
		tmp = xmlRealloc(buf, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buf);
		    return(NULL);
		}
		buf = tmp;
                size = newSize;
	    }
	    buf[len++] = cur;
	    NEXT;
	    cur = CUR;
        }
	buf[len] = 0;
    } else {
	xmlFatalErr(ctxt, XML_ERR_ENCODING_NAME, NULL);
    }
    return(buf);
}